

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_PngRgbIO_Test::~Image_PngRgbIO_Test(Image_PngRgbIO_Test *this)

{
  void *in_RDI;
  
  ~Image_PngRgbIO_Test((Image_PngRgbIO_Test *)0x5d7268);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Image, PngRgbIO) {
    Point2i res(11, 50);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    Image image(rgbPixels, res, {"R", "G", "B"});
    EXPECT_TRUE(image.Write("test.png"));
    ImageAndMetadata read = Image::Read("test.png");

    EXPECT_EQ(image.Resolution(), read.image.Resolution());
    EXPECT_EQ(read.image.Format(), PixelFormat::U256);
    ASSERT_TRUE(read.image.Encoding() != nullptr);
    // EXPECT_EQ(*read.image.Encoding(), *ColorEncodingHandle::sRGB);
    ASSERT_TRUE((bool)read.metadata.colorSpace);
    ASSERT_TRUE(*read.metadata.colorSpace != nullptr);
    EXPECT_EQ(*RGBColorSpace::sRGB, *read.metadata.GetColorSpace());

    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            for (int c = 0; c < 3; ++c) {
                EXPECT_LE(sRGBRoundTrip(image.GetChannel({x, y}, c), -.5f),
                          read.image.GetChannel({x, y}, c))
                    << " x " << x << ", y " << y << ", c " << c << ", orig "
                    << rgbPixels[3 * y * res[0] + 3 * x + c];
                EXPECT_LE(read.image.GetChannel({x, y}, c),
                          sRGBRoundTrip(image.GetChannel({x, y}, c), 0.5f))
                    << " x " << x << ", y " << y << ", c " << c << ", orig "
                    << rgbPixels[3 * y * res[0] + 3 * x + c];
            }

    EXPECT_EQ(0, remove("test.png"));
}